

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(void *ptr_id)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  uint *puVar3;
  ImU32 IVar4;
  int iVar5;
  uint *__dest;
  int iVar6;
  int iVar7;
  void *local_28;
  
  pIVar2 = GImGui->CurrentWindow;
  iVar7 = 8;
  local_28 = ptr_id;
  IVar4 = ImHash(&local_28,8,(pIVar2->IDStack).Data[(long)(pIVar2->IDStack).Size + -1]);
  iVar5 = (pIVar2->IDStack).Size;
  if (iVar5 == (pIVar2->IDStack).Capacity) {
    if (iVar5 != 0) {
      iVar7 = iVar5 / 2 + iVar5;
    }
    iVar6 = iVar5 + 1;
    if (iVar5 + 1 < iVar7) {
      iVar6 = iVar7;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
    puVar3 = (pIVar2->IDStack).Data;
    if (puVar3 != (uint *)0x0) {
      memcpy(__dest,puVar3,(long)(pIVar2->IDStack).Size << 2);
      puVar3 = (pIVar2->IDStack).Data;
      if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
    }
    (pIVar2->IDStack).Data = __dest;
    (pIVar2->IDStack).Capacity = iVar6;
    iVar5 = (pIVar2->IDStack).Size;
  }
  else {
    __dest = (pIVar2->IDStack).Data;
  }
  __dest[iVar5] = IVar4;
  (pIVar2->IDStack).Size = (pIVar2->IDStack).Size + 1;
  return;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = toupper(*str2) - toupper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}